

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

h264_macroblock * h264_inter_filter(h264_slice *slice,h264_macroblock *mb,int inter)

{
  int iVar1;
  int inter_local;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  
  slice_local = (h264_slice *)mb;
  if ((((inter == 0) && (slice->picparm->constrained_intra_pred_flag != 0)) &&
      (slice->nal_unit_type == 2)) && (iVar1 = h264_is_inter_mb_type(mb->mb_type), iVar1 != 0)) {
    slice_local = (h264_slice *)h264_mb_unavail(1);
  }
  return (h264_macroblock *)slice_local;
}

Assistant:

const struct h264_macroblock *h264_inter_filter(struct h264_slice *slice, const struct h264_macroblock *mb, int inter) {
	if (!inter
			&& slice->picparm->constrained_intra_pred_flag
			&& slice->nal_unit_type == H264_NAL_UNIT_TYPE_SLICE_PART_A
			&& h264_is_inter_mb_type(mb->mb_type))
		return h264_mb_unavail(1);
	else
		return mb;
}